

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O1

bool __thiscall glslang::HlslGrammar::acceptSamplerState(HlslGrammar *this)

{
  HlslToken *pHVar1;
  pointer pcVar2;
  size_type sVar3;
  anon_union_8_5_54ae9b2d_for_HlslToken_2 aVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  HlslParseContext *pHVar10;
  _func_int **pp_Var11;
  size_type sVar12;
  TIntermTyped *lodBias;
  TString stateName;
  HlslToken state;
  HlslToken local_a8;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_80;
  HlslToken local_58;
  
  bVar5 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftBrace);
  bVar6 = true;
  if (bVar5) {
    pHVar1 = &(this->super_HlslTokenStream).token;
    (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
              (this->parseContext,pHVar1,"unimplemented","immediate sampler state","");
    do {
      local_58.field_2.string = (TString *)0x0;
      local_58.loc.name = (TString *)0x0;
      local_58.loc.string = 0;
      local_58.loc.line = 0;
      local_58.loc.column = 0;
      bVar5 = acceptIdentifier(this,&local_58);
      aVar4 = local_58.field_2;
      iVar7 = 2;
      if (bVar5) {
        local_80._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        pcVar2 = ((aVar4.string)->_M_dataplus)._M_p;
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                             *)&local_80,pcVar2,pcVar2 + (aVar4.string)->_M_string_length);
        sVar3 = local_80._M_string_length;
        pcVar2 = local_80._M_dataplus._M_p;
        if (local_80._M_string_length != 0) {
          sVar12 = 0;
          do {
            iVar7 = tolower((int)pcVar2[sVar12]);
            pcVar2[sVar12] = (char)iVar7;
            sVar12 = sVar12 + 1;
          } while (sVar3 != sVar12);
        }
        bVar5 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokAssign);
        if (bVar5) {
          iVar7 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(&local_80,"minlod");
          if (((iVar7 == 0) ||
              (iVar7 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                       compare(&local_80,"maxlod"), iVar7 == 0)) ||
             (iVar7 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      compare(&local_80,"maxanisotropy"), iVar7 == 0)) {
            bVar5 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokIntConstant);
            if (bVar5) {
              local_a8.loc.name = (TString *)0x0;
              bVar5 = acceptLiteral(this,(TIntermTyped **)&local_a8);
              iVar7 = 1;
              if (bVar5) goto LAB_003a2406;
              goto LAB_003a246c;
            }
            pHVar10 = this->parseContext;
            pp_Var11 = (pHVar10->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
            pcVar9 = "integer";
          }
          else {
            iVar7 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    compare(&local_80,"filter");
            if (iVar7 == 0) {
              local_a8.field_2.string = (TString *)0x0;
              local_a8.loc.name = (TString *)0x0;
              local_a8.loc.string = 0;
              local_a8.loc.line = 0;
              local_a8.loc.column = 0;
              bVar5 = acceptIdentifier(this,&local_a8);
              if (bVar5) {
LAB_003a2406:
                bVar5 = HlslTokenStream::acceptTokenClass
                                  (&this->super_HlslTokenStream,EHTokSemicolon);
                iVar7 = 0;
                if (bVar5) goto LAB_003a246c;
                pHVar10 = this->parseContext;
                pp_Var11 = (pHVar10->super_TParseContextBase).super_TParseVersions.
                           _vptr_TParseVersions;
                pcVar9 = "semicolon";
              }
              else {
                pHVar10 = this->parseContext;
                pp_Var11 = (pHVar10->super_TParseContextBase).super_TParseVersions.
                           _vptr_TParseVersions;
                pcVar9 = "filter mode";
              }
            }
            else {
              iVar7 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      compare(&local_80,"addressu");
              if (((iVar7 == 0) ||
                  (iVar7 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           ::compare(&local_80,"addressv"), iVar7 == 0)) ||
                 (iVar7 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          ::compare(&local_80,"addressw"), iVar7 == 0)) {
                local_a8.field_2.string = (TString *)0x0;
                local_a8.loc.name = (TString *)0x0;
                local_a8.loc.string = 0;
                local_a8.loc.line = 0;
                local_a8.loc.column = 0;
                bVar5 = acceptIdentifier(this,&local_a8);
                if (bVar5) goto LAB_003a2406;
                pHVar10 = this->parseContext;
                pp_Var11 = (pHVar10->super_TParseContextBase).super_TParseVersions.
                           _vptr_TParseVersions;
                pcVar9 = "texture address mode";
              }
              else {
                iVar7 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                        compare(&local_80,"miplodbias");
                if (iVar7 != 0) {
                  iVar8 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          ::compare(&local_80,"bordercolor");
                  iVar7 = 1;
                  if (iVar8 != 0) {
                    (*(this->parseContext->super_TParseContextBase).super_TParseVersions.
                      _vptr_TParseVersions[0x2d])
                              (this->parseContext,pHVar1,"Expected","texture state","");
                  }
                  goto LAB_003a246c;
                }
                local_a8.loc.name = (TString *)0x0;
                bVar5 = acceptLiteral(this,(TIntermTyped **)&local_a8);
                if (bVar5) goto LAB_003a2406;
                pHVar10 = this->parseContext;
                pp_Var11 = (pHVar10->super_TParseContextBase).super_TParseVersions.
                           _vptr_TParseVersions;
                pcVar9 = "lod bias";
              }
            }
          }
        }
        else {
          pHVar10 = this->parseContext;
          pp_Var11 = (pHVar10->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar9 = "assign";
        }
        (*pp_Var11[0x2d])(pHVar10,pHVar1,"Expected",pcVar9,"");
        iVar7 = 1;
      }
LAB_003a246c:
    } while (iVar7 == 0);
    if (iVar7 == 1) {
      bVar6 = false;
    }
    else {
      bVar6 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightBrace);
    }
  }
  return bVar6;
}

Assistant:

bool HlslGrammar::acceptSamplerState()
{
    // TODO: this should be genericized to accept a list of valid tokens and
    // return token/value pairs.  Presently it is specific to texture values.

    if (! acceptTokenClass(EHTokLeftBrace))
        return true;

    parseContext.warn(token.loc, "unimplemented", "immediate sampler state", "");

    do {
        // read state name
        HlslToken state;
        if (! acceptIdentifier(state))
            break;  // end of list

        // FXC accepts any case
        TString stateName = *state.string;
        std::transform(stateName.begin(), stateName.end(), stateName.begin(), ::tolower);

        if (! acceptTokenClass(EHTokAssign)) {
            expected("assign");
            return false;
        }

        if (stateName == "minlod" || stateName == "maxlod") {
            if (! peekTokenClass(EHTokIntConstant)) {
                expected("integer");
                return false;
            }

            TIntermTyped* lod = nullptr;
            if (! acceptLiteral(lod))  // should never fail, since we just looked for an integer
                return false;
        } else if (stateName == "maxanisotropy") {
            if (! peekTokenClass(EHTokIntConstant)) {
                expected("integer");
                return false;
            }

            TIntermTyped* maxAnisotropy = nullptr;
            if (! acceptLiteral(maxAnisotropy))  // should never fail, since we just looked for an integer
                return false;
        } else if (stateName == "filter") {
            HlslToken filterMode;
            if (! acceptIdentifier(filterMode)) {
                expected("filter mode");
                return false;
            }
        } else if (stateName == "addressu" || stateName == "addressv" || stateName == "addressw") {
            HlslToken addrMode;
            if (! acceptIdentifier(addrMode)) {
                expected("texture address mode");
                return false;
            }
        } else if (stateName == "miplodbias") {
            TIntermTyped* lodBias = nullptr;
            if (! acceptLiteral(lodBias)) {
                expected("lod bias");
                return false;
            }
        } else if (stateName == "bordercolor") {
            return false;
        } else {
            expected("texture state");
            return false;
        }

        // SEMICOLON
        if (! acceptTokenClass(EHTokSemicolon)) {
            expected("semicolon");
            return false;
        }
    } while (true);

    if (! acceptTokenClass(EHTokRightBrace))
        return false;

    return true;
}